

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 *in_RDI;
  ImRect *in_stack_ffffffffffffff90;
  ImVector<float> *this_00;
  ImVec1 local_48;
  ImVec1 local_44;
  ImVec1 local_40;
  ImVec2 local_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  ImVec2 local_24;
  ImVec2 local_1c [3];
  
  ImVec2::ImVec2(in_RDI);
  ImVec2::ImVec2(in_RDI + 1);
  ImVec2::ImVec2(in_RDI + 2);
  ImVec2::ImVec2(in_RDI + 3);
  ImVec2::ImVec2(in_RDI + 4);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[5].y);
  ImRect::ImRect(in_stack_ffffffffffffff90);
  ImRect::ImRect(in_stack_ffffffffffffff90);
  ImVec2::ImVec2(in_RDI + 0x10);
  ImVector<ImGuiWindow_*>::ImVector((ImVector<ImGuiWindow_*> *)(in_RDI + 0x11));
  ImVector<int>::ImVector((ImVector<int> *)(in_RDI + 0x17));
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x19));
  this_00 = (ImVector<float> *)(in_RDI + 0x1b);
  ImVector<float>::ImVector(this_00);
  ImVector<ImGuiGroupData>::ImVector((ImVector<ImGuiGroupData> *)(in_RDI + 0x1d));
  ImVec1::ImVec1((ImVec1 *)&in_RDI[0x20].y);
  ImVec1::ImVec1((ImVec1 *)(in_RDI + 0x21));
  ImVec1::ImVec1((ImVec1 *)&in_RDI[0x21].y);
  ImVec2::ImVec2(local_1c,0.0,0.0);
  in_RDI[3] = local_1c[0];
  in_RDI[2] = in_RDI[3];
  in_RDI[1] = in_RDI[2];
  *in_RDI = in_RDI[1];
  ImVec2::ImVec2(&local_24,0.0,0.0);
  *(ImVec2 *)&in_RDI[5].y = local_24;
  in_RDI[4] = *(ImVec2 *)&in_RDI[5].y;
  in_RDI[6].y = 0.0;
  in_RDI[5].x = 0.0;
  in_RDI[7].x = -1.0;
  in_RDI[7].y = 0.0;
  in_RDI[8].x = 0.0;
  in_RDI[8].y = 0.0;
  in_RDI[9].x = 0.0;
  ImRect::ImRect((ImRect *)this_00);
  *(undefined8 *)&in_RDI[0xb].y = local_34;
  *(undefined8 *)&in_RDI[0xc].y = uStack_2c;
  *(undefined8 *)&in_RDI[9].y = *(undefined8 *)&in_RDI[0xb].y;
  *(undefined8 *)&in_RDI[10].y = *(undefined8 *)&in_RDI[0xc].y;
  in_RDI[0xf].x = 0.0;
  in_RDI[0xe].y = 0.0;
  in_RDI[0xd].y = 0.0;
  in_RDI[0xe].x = 1.4013e-45;
  *(undefined1 *)&in_RDI[0xf].y = 0;
  *(undefined1 *)((long)&in_RDI[0xf].y + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xf].y + 2) = 0;
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  in_RDI[0x10] = local_3c;
  in_RDI[0x13].x = 0.0;
  in_RDI[0x13].y = 0.0;
  in_RDI[0x14].y = 1.4013e-45;
  in_RDI[0x14].x = 1.4013e-45;
  in_RDI[0x15].y = 0.0;
  in_RDI[0x15].x = 0.0;
  in_RDI[0x16].x = -1.0;
  in_RDI[0x20].x = 0.0;
  in_RDI[0x1f].x = 0.0;
  in_RDI[0x1f].y = 0.0;
  ImVec1::ImVec1(&local_40,0.0);
  in_RDI[0x20].y = local_40.x;
  ImVec1::ImVec1(&local_44,0.0);
  in_RDI[0x21].x = local_44.x;
  ImVec1::ImVec1(&local_48,0.0);
  in_RDI[0x21].y = local_48.x;
  in_RDI[0x22].x = 0.0;
  in_RDI[0x22].y = 0.0;
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrentLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrentLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        LogLinePosY = -1.0f;
        TreeDepth = 0;
        TreeDepthMayJumpToParentOnPop = 0x00;
        LastItemId = 0;
        LastItemStatusFlags = 0;
        LastItemRect = LastItemDisplayRect = ImRect();
        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;
        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        StateStorage = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        ItemWidth = 0.0f;
        ItemFlags = ImGuiItemFlags_Default_;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));

        Indent = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        ColumnsSet = NULL;
    }